

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

MemoryDataParameter * __thiscall
caffe::V1LayerParameter::mutable_memory_data_param(V1LayerParameter *this)

{
  MemoryDataParameter *this_00;
  V1LayerParameter *this_local;
  
  set_has_memory_data_param(this);
  if (this->memory_data_param_ == (MemoryDataParameter *)0x0) {
    this_00 = (MemoryDataParameter *)operator_new(0x28);
    MemoryDataParameter::MemoryDataParameter(this_00);
    this->memory_data_param_ = this_00;
  }
  return this->memory_data_param_;
}

Assistant:

inline ::caffe::MemoryDataParameter* V1LayerParameter::mutable_memory_data_param() {
  set_has_memory_data_param();
  if (memory_data_param_ == NULL) {
    memory_data_param_ = new ::caffe::MemoryDataParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.V1LayerParameter.memory_data_param)
  return memory_data_param_;
}